

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::VertexExpanderShader
          (VertexExpanderShader *this,ContextType *contextType,GeometryShaderInputType inputType,
          GeometryShaderOutputType outputType)

{
  ShaderProgramDeclaration *pSVar1;
  ostream *poVar2;
  GeometryShaderInputType inputType_00;
  GeometryShaderOutputType outputType_00;
  FragmentSource *c;
  ostringstream str;
  allocator<char> local_4a4;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  string local_4a0;
  ShaderProgramDeclaration *local_480;
  FragmentOutput local_474;
  string local_470;
  GeometrySource local_450;
  string local_430;
  string local_410;
  FragmentSource local_3f0;
  string local_3d0;
  string local_3b0;
  VertexSource local_390;
  string local_370 [32];
  string local_350 [32];
  GeometryToFragmentVarying local_330;
  VertexToGeometryVarying local_328;
  VertexAttribute local_320;
  VertexAttribute local_2f8;
  GeometryShaderDeclaration local_2d0;
  ostream local_2b8;
  ShaderProgramDeclaration local_140;
  
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e47750;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e47788;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e477a0;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"a_position",&local_4a1);
  std::__cxx11::string::string((string *)&local_2f8,local_350);
  local_2f8.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>(local_370,"a_color",&local_4a2);
  std::__cxx11::string::string((string *)&local_320,local_370);
  local_320.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_320);
  local_328.type = GENERICVECTYPE_FLOAT;
  local_328.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_328);
  local_330.type = GENERICVECTYPE_FLOAT;
  local_330.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_330);
  local_474.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_474);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,&local_4a3);
  specializeShader(&local_3b0,&local_3d0,contextType);
  std::__cxx11::string::string((string *)&local_390,(string *)&local_3b0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_390);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_4a4);
  specializeShader(&local_410,&local_430,contextType);
  std::__cxx11::string::string((string *)&local_3f0,(string *)&local_410);
  c = &local_3f0;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,c);
  local_2d0.numOutputVertices =
       calcOutputVertices((VertexExpanderShader *)(ulong)inputType,(GeometryShaderInputType)c);
  local_2d0.numInvocations = 1;
  local_2d0.inputType = inputType;
  local_2d0.outputType = outputType;
  local_480 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b8);
  std::operator<<(&local_2b8,"${GLSL_VERSION_DECL}\n");
  std::operator<<(&local_2b8,"${GLSL_EXT_GEOMETRY_SHADER}");
  poVar2 = std::operator<<(&local_2b8,"layout(");
  Functional::(anonymous_namespace)::inputTypeToGLString_abi_cxx11_
            (&local_4a0,(_anonymous_namespace_ *)(ulong)inputType,inputType_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_4a0);
  std::operator<<(poVar2,") in;\n");
  std::__cxx11::string::~string((string *)&local_4a0);
  poVar2 = std::operator<<(&local_2b8,"layout(");
  Functional::(anonymous_namespace)::outputTypeToGLString_abi_cxx11_
            (&local_4a0,(_anonymous_namespace_ *)(ulong)outputType,outputType_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_4a0);
  poVar2 = std::operator<<(poVar2,", max_vertices = ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,") out;");
  std::__cxx11::string::~string((string *)&local_4a0);
  std::operator<<(&local_2b8,"\n");
  std::operator<<(&local_2b8,
                  "in highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n\tconst highp vec4 offset0 = vec4(-0.07, -0.01, 0.0, 0.0);\n\tconst highp vec4 offset1 = vec4( 0.03, -0.03, 0.0, 0.0);\n\tconst highp vec4 offset2 = vec4(-0.01,  0.08, 0.0, 0.0);\n\t      highp vec4 yoffset = float(gl_PrimitiveIDIn) * vec4(0.02, 0.1, 0.0, 0.0);\n\n\tfor (highp int ndx = 0; ndx < gl_in.length(); ndx++)\n\t{\n\t\tgl_Position = gl_in[ndx].gl_Position + offset0 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\n\t\tgl_Position = gl_in[ndx].gl_Position + offset1 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\n\t\tgl_Position = gl_in[ndx].gl_Position + offset2 + yoffset;\n\t\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\t\tv_frag_FragColor = v_geom_FragColor[ndx];\n\t\tEmitVertex();\n\t\tEndPrimitive();\n\t}\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  specializeShader(&local_470,&local_4a0,contextType);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b8);
  std::__cxx11::string::string((string *)&local_450,(string *)&local_470);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(local_480,&local_450);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string(local_350);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e47750;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e47788;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e477a0;
  return;
}

Assistant:

VertexExpanderShader::VertexExpanderShader (const glu::ContextType& contextType, rr::GeometryShaderInputType inputType, rr::GeometryShaderOutputType outputType)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToGeometryVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::GeometryToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(specializeShader(s_commonShaderSourceVertex, contextType))
							<< sglr::pdec::FragmentSource(specializeShader(s_commonShaderSourceFragment, contextType))
							<< sglr::pdec::GeometryShaderDeclaration(inputType, outputType, calcOutputVertices(inputType))
							<< sglr::pdec::GeometrySource(genGeometrySource(contextType, inputType, outputType)))
{
}